

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::RenderingInfoWrapper::RenderingInfoWrapper
          (RenderingInfoWrapper *this,size_t Hash,uint32_t ColorAttachmentCount,
          bool UseDepthAttachment,bool UseStencilAttachment)

{
  type pVVar1;
  Char *Message;
  bool bVar2;
  undefined1 local_70 [8];
  string msg;
  type pVStack_48;
  uint32_t AttachmentInd;
  size_t i;
  unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
  local_30;
  uint local_24;
  byte local_1e;
  byte local_1d;
  uint32_t TotalAttachmentCount;
  bool UseStencilAttachment_local;
  bool UseDepthAttachment_local;
  size_t sStack_18;
  uint32_t ColorAttachmentCount_local;
  size_t Hash_local;
  RenderingInfoWrapper *this_local;
  
  local_1e = UseStencilAttachment;
  local_1d = UseDepthAttachment;
  TotalAttachmentCount = ColorAttachmentCount;
  sStack_18 = Hash;
  Hash_local = (size_t)this;
  memset(this,0,0x48);
  this->m_Hash = sStack_18;
  std::unique_ptr<VkRenderingAttachmentInfo[],std::default_delete<VkRenderingAttachmentInfo[]>>::
  unique_ptr<std::default_delete<VkRenderingAttachmentInfo[]>,void>
            ((unique_ptr<VkRenderingAttachmentInfo[],std::default_delete<VkRenderingAttachmentInfo[]>>
              *)&this->m_Attachments);
  std::
  unique_ptr<VkRenderingFragmentShadingRateAttachmentInfoKHR,std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>>
  ::unique_ptr<std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>,void>
            ((unique_ptr<VkRenderingFragmentShadingRateAttachmentInfoKHR,std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>>
              *)&this->m_ShadingRateAttachment);
  this->m_DepthAttachmentIndex = 0xffffffff;
  this->m_StencilAttachmentIndex = 0xffffffff;
  this->m_AttachmentClearMask = 0;
  (this->m_RI).sType = VK_STRUCTURE_TYPE_RENDERING_INFO;
  (this->m_RI).pNext = (void *)0x0;
  (this->m_RI).flags = 0;
  (this->m_RI).colorAttachmentCount = TotalAttachmentCount;
  bVar2 = (local_1e & 1) != 0;
  pVVar1 = (type)(ulong)bVar2;
  local_24 = TotalAttachmentCount + ((local_1d & 1) != 0) + (uint)bVar2;
  if (local_24 != 0) {
    std::make_unique<VkRenderingAttachmentInfo[]>((size_t)&local_30);
    std::unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
    ::operator=(&this->m_Attachments,&local_30);
    std::unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
    ::~unique_ptr(&local_30);
    for (pVStack_48 = (type)0x0; pVVar1 = (type)(ulong)local_24, pVStack_48 < pVVar1;
        pVStack_48 = (type)((long)&pVStack_48->sType + 1)) {
      pVVar1 = std::
               unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
               ::operator[](&this->m_Attachments,(size_t)pVStack_48);
      pVVar1->sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO;
    }
  }
  msg.field_2._12_4_ = 0;
  if (TotalAttachmentCount != 0) {
    pVVar1 = std::
             unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ::operator[](&this->m_Attachments,0);
    (this->m_RI).pColorAttachments = pVVar1;
    msg.field_2._12_4_ = TotalAttachmentCount + msg.field_2._12_4_;
  }
  if ((local_1d & 1) != 0) {
    this->m_DepthAttachmentIndex = msg.field_2._12_4_;
    pVVar1 = std::
             unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ::operator[](&this->m_Attachments,(ulong)(uint)msg.field_2._12_4_);
    (this->m_RI).pDepthAttachment = pVVar1;
    msg.field_2._12_4_ = msg.field_2._12_4_ + 1;
  }
  if ((local_1e & 1) != 0) {
    this->m_StencilAttachmentIndex = msg.field_2._12_4_;
    pVVar1 = std::
             unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ::operator[](&this->m_Attachments,(ulong)(uint)msg.field_2._12_4_);
    (this->m_RI).pStencilAttachment = pVVar1;
    msg.field_2._12_4_ = msg.field_2._12_4_ + 1;
  }
  if (msg.field_2._12_4_ != local_24) {
    Diligent::FormatString<char[26],char[38]>
              ((string *)local_70,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AttachmentInd == TotalAttachmentCount",(char (*) [38])pVVar1);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"RenderingInfoWrapper",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
               ,0x48);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

RenderingInfoWrapper::RenderingInfoWrapper(size_t   Hash,
                                           uint32_t ColorAttachmentCount,
                                           bool     UseDepthAttachment,
                                           bool     UseStencilAttachment) :
    m_RI{},
    m_Hash{Hash}
{
    m_RI.sType                = VK_STRUCTURE_TYPE_RENDERING_INFO_KHR;
    m_RI.pNext                = nullptr;
    m_RI.flags                = 0;
    m_RI.colorAttachmentCount = ColorAttachmentCount;

    const uint32_t TotalAttachmentCount = ColorAttachmentCount + (UseDepthAttachment ? 1u : 0u) + (UseStencilAttachment ? 1u : 0u);
    if (TotalAttachmentCount > 0)
    {
        m_Attachments = std::make_unique<VkRenderingAttachmentInfo[]>(TotalAttachmentCount);
        for (size_t i = 0; i < TotalAttachmentCount; ++i)
            m_Attachments[i].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO_KHR;
    }
    uint32_t AttachmentInd = 0;
    if (ColorAttachmentCount > 0)
    {
        m_RI.pColorAttachments = &m_Attachments[AttachmentInd];
        AttachmentInd += ColorAttachmentCount;
    }
    if (UseDepthAttachment)
    {
        m_DepthAttachmentIndex = AttachmentInd;
        m_RI.pDepthAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    if (UseStencilAttachment)
    {
        m_StencilAttachmentIndex = AttachmentInd;
        m_RI.pStencilAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    VERIFY_EXPR(AttachmentInd == TotalAttachmentCount);
}